

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int lj_cf_ffi_istype(lua_State *L)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  CTState *cts;
  CTypeID id;
  uint uVar4;
  TValue *pTVar5;
  ulong uVar6;
  CType *d;
  CType *s;
  CTypeID id_00;
  uint64_t uVar7;
  bool bVar8;
  
  uVar7 = 0xffff7fffffffffff;
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  id = ffi_checkctype(L,cts,(TValue *)0x0);
  pTVar5 = lj_lib_checkany(L,2);
  if ((pTVar5->u64 & 0xffff800000000000) != 0xfffa800000000000) goto LAB_0015e882;
  uVar6 = pTVar5->u64 & 0x7fffffffffff;
  uVar1 = *(ushort *)(uVar6 + 10);
  id_00 = (CTypeID)uVar1;
  if (uVar1 == 0x16) {
    id_00 = *(CTypeID *)(uVar6 + 0x10);
  }
  d = lj_ctype_rawref(cts,id);
  s = lj_ctype_rawref(cts,id_00);
  if (d == s) {
    uVar4 = 1;
  }
  else {
    uVar2 = d->info;
    uVar3 = s->info;
    if ((uVar2 >> 0x1c == uVar3 >> 0x1c) && (d->size == s->size)) {
      if ((uVar2 & 0xe0000000) == 0x20000000) {
        uVar4 = lj_cconv_compatptr(cts,d,s,8);
      }
      else {
        uVar4 = 0;
        if (uVar2 < 0x10000000 || uVar2 >> 0x1c == 4) {
          bVar8 = ((uVar3 ^ uVar2) & 0xfcbfffff) == 0;
          goto LAB_0015e86c;
        }
      }
    }
    else {
      uVar4 = 0;
      if (((uVar2 & 0xf0000000) == 0x10000000) && ((uVar3 & 0xf0000000) == 0x20000000)) {
        bVar8 = d == cts->tab + (uVar3 & 0xffff);
LAB_0015e86c:
        uVar4 = (uint)bVar8;
      }
    }
  }
  uVar7 = ~((ulong)(uVar4 + 1) << 0x2f);
LAB_0015e882:
  L->top[-1].u64 = uVar7;
  *(uint64_t *)((L->glref).ptr64 + 0xf0) = uVar7;
  return 1;
}

Assistant:

LJLIB_CF(ffi_istype)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  CTypeID id1 = ffi_checkctype(L, cts, NULL);
  TValue *o = lj_lib_checkany(L, 2);
  int b = 0;
  if (tviscdata(o)) {
    GCcdata *cd = cdataV(o);
    CTypeID id2 = cd->ctypeid == CTID_CTYPEID ? *(CTypeID *)cdataptr(cd) :
						cd->ctypeid;
    CType *ct1 = lj_ctype_rawref(cts, id1);
    CType *ct2 = lj_ctype_rawref(cts, id2);
    if (ct1 == ct2) {
      b = 1;
    } else if (ctype_type(ct1->info) == ctype_type(ct2->info) &&
	       ct1->size == ct2->size) {
      if (ctype_ispointer(ct1->info))
	b = lj_cconv_compatptr(cts, ct1, ct2, CCF_IGNQUAL);
      else if (ctype_isnum(ct1->info) || ctype_isvoid(ct1->info))
	b = (((ct1->info ^ ct2->info) & ~(CTF_QUAL|CTF_LONG)) == 0);
    } else if (ctype_isstruct(ct1->info) && ctype_isptr(ct2->info) &&
	       ct1 == ctype_rawchild(cts, ct2)) {
      b = 1;
    }
  }
  setboolV(L->top-1, b);
  setboolV(&G(L)->tmptv2, b);  /* Remember for trace recorder. */
  return 1;
}